

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void update_Z_and_wbar(update_data_conflict *data,float x,float *wref)

{
  int iVar1;
  float *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  double dVar2;
  int i;
  float s;
  int m;
  float *w;
  int local_2c;
  float local_c;
  
  iVar1 = *(int *)(*in_RDI + 8);
  local_c = in_XMM0_Da;
  if ((*(byte *)(*in_RDI + 0xac) & 1) != 0) {
    dVar2 = std::sqrt((double)(ulong)(uint)in_RSI[iVar1 + 1]);
    local_c = in_XMM0_Da / SUB84(dVar2,0);
  }
  local_c = *(float *)((long)in_RDI + 0xc) * local_c;
  for (local_2c = 1; local_2c <= iVar1; local_2c = local_2c + 1) {
    in_RSI[local_2c] =
         (*(float *)(in_RDI[5] + (long)local_2c * 4) * local_c) /
         *(float *)(*(long *)(*in_RDI + 0x30) + (long)local_2c * 4) + in_RSI[local_2c];
  }
  *in_RSI = -local_c * *(float *)(in_RDI + 6) + *in_RSI;
  return;
}

Assistant:

void update_Z_and_wbar(update_data& data, float x, float& wref)
{
  float* w = &wref;
  int m = data.ON->m;
  if (data.ON->normalize)
    x /= sqrt(w[NORM2]);
  float s = data.sketch_cnt * x;

  for (int i = 1; i <= m; i++)
  {
    w[i] += data.delta[i] * s / data.ON->D[i];
  }
  w[0] -= s * data.bdelta;
}